

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam_hdr_t * sam_hdr_parse(int l_text,char *text)

{
  char *__src;
  char cVar1;
  uint uVar2;
  int64_t *piVar3;
  long lVar4;
  khint_t kVar5;
  kh_s2i_t *h;
  char *pcVar6;
  bam_hdr_t *pbVar7;
  uint32_t *puVar8;
  char **ppcVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  size_t __n;
  char *pcVar14;
  char *local_40;
  int absent;
  
  h = kh_init_s2i();
  do {
    if (*text == '@') {
      if ((text[1] == 'S') && (text[2] == 'Q')) {
        local_40 = text + 4;
        pcVar6 = (kh_cstr_t)0x0;
        uVar11 = 0xffffffff;
        do {
          if (*local_40 == 'L') {
            if ((local_40[1] == 'N') && (local_40[2] == ':')) {
              uVar11 = strtol(local_40 + 3,&local_40,10);
            }
          }
          else if (((*local_40 == 'S') && (local_40[1] == 'N')) && (local_40[2] == ':')) {
            __src = local_40 + 3;
            pcVar14 = local_40 + 2;
            __n = 0xffffffffffffffff;
            do {
              sVar13 = __n;
              pcVar6 = pcVar14 + 1;
              pcVar14 = pcVar14 + 1;
              __n = sVar13 + 1;
            } while (1 < (byte)(*pcVar6 - 9U));
            local_40 = __src;
            pcVar6 = (char *)calloc(sVar13 + 2,1);
            strncpy(pcVar6,__src,__n);
            local_40 = pcVar14;
          }
          do {
            text = local_40;
            local_40 = text + 1;
          } while (1 < (byte)(*text - 9U));
        } while (*text != '\n');
        local_40 = text;
        if ((pcVar6 != (kh_cstr_t)0x0) && (-1 < (int)uVar11)) {
          kVar5 = kh_put_s2i(h,pcVar6,&absent);
          if (absent == 0) {
            if (1 < hts_verbose) {
              fprintf(_stderr,"[W::%s] duplicated sequence \'%s\'\n","sam_hdr_parse",pcVar6);
            }
            free(pcVar6);
          }
          else {
            h->vals[kVar5] = uVar11 & 0xffffffff | (ulong)(h->size - 1) << 0x20;
          }
        }
      }
    }
    else if (*text == '\0') {
      pbVar7 = bam_hdr_init();
      pbVar7->sdict = h;
      kVar5 = h->size;
      pbVar7->n_targets = kVar5;
      puVar8 = (uint32_t *)malloc((long)(int)kVar5 * 4);
      pbVar7->target_len = puVar8;
      ppcVar9 = (char **)malloc((long)(int)kVar5 << 3);
      pbVar7->target_name = ppcVar9;
      uVar2 = h->n_buckets;
      bVar10 = 0;
      for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
        if ((h->flags[uVar11 >> 4 & 0xfffffff] >> (bVar10 & 0x1e) & 3) == 0) {
          piVar3 = h->vals;
          lVar4 = piVar3[uVar11];
          lVar12 = lVar4 >> 0x20;
          ppcVar9[lVar12] = h->keys[uVar11];
          puVar8[lVar12] = (uint32_t)lVar4;
          piVar3[uVar11] = lVar12;
        }
        bVar10 = bVar10 + 2;
      }
      return pbVar7;
    }
    do {
      pcVar6 = text + 1;
      cVar1 = *text;
      text = pcVar6;
    } while (cVar1 != '\n');
  } while( true );
}

Assistant:

bam_hdr_t *sam_hdr_parse(int l_text, const char *text)
{
    const char *q, *r, *p;
    khash_t(s2i) *d;
    d = kh_init(s2i);
    for (p = text; *p; ++p) {
        if (strncmp(p, "@SQ", 3) == 0) {
            char *sn = 0;
            int ln = -1;
            for (q = p + 4;; ++q) {
                if (strncmp(q, "SN:", 3) == 0) {
                    q += 3;
                    for (r = q; *r != '\t' && *r != '\n'; ++r);
                    sn = (char*)calloc(r - q + 1, 1);
                    strncpy(sn, q, r - q);
                    q = r;
                } else if (strncmp(q, "LN:", 3) == 0)
                    ln = strtol(q + 3, (char**)&q, 10);
                while (*q != '\t' && *q != '\n') ++q;
                if (*q == '\n') break;
            }
            p = q;
            if (sn && ln >= 0) {
                khint_t k;
                int absent;
                k = kh_put(s2i, d, sn, &absent);
                if (!absent) {
                    if (hts_verbose >= 2)
                        fprintf(stderr, "[W::%s] duplicated sequence '%s'\n", __func__, sn);
                    free(sn);
                } else kh_val(d, k) = (int64_t)(kh_size(d) - 1)<<32 | ln;
            }
        }
        while (*p != '\n') ++p;
    }
    return hdr_from_dict(d);
}